

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O0

void libithicap_output(char *descr,iaddr from,iaddr to,uint8_t proto,uint flags,uint sport,
                      uint dport,my_bpftimeval ts,u_char *pkt_copy,uint olen,u_char *payload,
                      uint payloadlen)

{
  bool bVar1;
  size_t local_48;
  size_t dest_addr_length;
  uint8_t *dest_addr;
  size_t source_addr_length;
  uint8_t *source_addr;
  u_char *pkt_copy_local;
  uint dport_local;
  uint sport_local;
  uint flags_local;
  uint8_t proto_local;
  char *descr_local;
  
  if (((libithicap_stats != (DnsStats *)0x0) &&
      (bVar1 = DnsStats::IsCaptureStopped(libithicap_stats), !bVar1)) && ((flags & 2) != 0)) {
    if (from.af == 2) {
      dest_addr = (uint8_t *)0x4;
    }
    else {
      dest_addr = (uint8_t *)0x10;
    }
    source_addr_length = (size_t)&from.u;
    if (to.af == 2) {
      local_48 = 4;
    }
    else {
      local_48 = 0x10;
    }
    dest_addr_length = (size_t)&to.u;
    DnsStats::SubmitPacket
              (libithicap_stats,payload,payloadlen,(uint8_t *)source_addr_length,(size_t)dest_addr,
               (uint8_t *)dest_addr_length,local_48,ts);
  }
  return;
}

Assistant:

void libithicap_output(const char* descr, iaddr from, iaddr to, uint8_t proto, 
        unsigned flags,
        unsigned sport, unsigned dport, my_bpftimeval ts,
        const u_char* pkt_copy, const unsigned olen,
        const u_char* payload, const unsigned payloadlen)
    {
        /* Need to do a little bit of massaging between the version of 
         * addresses used by DNSCAP and that used by ITHITOOLS */
        uint8_t * source_addr;
        size_t source_addr_length;
        uint8_t * dest_addr;
        size_t dest_addr_length;

        UNREFERENCED_PARAMETER(descr);
        UNREFERENCED_PARAMETER(proto);
        UNREFERENCED_PARAMETER(sport);
        UNREFERENCED_PARAMETER(dport);
        UNREFERENCED_PARAMETER(ts);
        UNREFERENCED_PARAMETER(pkt_copy);
        UNREFERENCED_PARAMETER(olen);


        if (libithicap_stats == NULL ||
            libithicap_stats->IsCaptureStopped()) {
            return;
        }

        if ((flags & DNSCAP_OUTPUT_ISDNS) == 0)
        {
            /* A fragment, not a DNS Packet */
            return;
        }

        switch (from.af)
        {
        case AF_INET:
            source_addr = (uint8_t *) &from.u.a4;
            source_addr_length = 4;
            break;
        default:
            source_addr = (uint8_t *)&from.u.a6;
            source_addr_length = 16;
            break;
        }

        switch (to.af)
        {
        case AF_INET:
            dest_addr = (uint8_t *)&to.u.a4;
            dest_addr_length = 4;
            break;
        default:
            dest_addr = (uint8_t *)&to.u.a6;
            dest_addr_length = 16;
            break;
        }

        libithicap_stats->SubmitPacket((uint8_t *)payload, payloadlen,
            source_addr, source_addr_length, dest_addr, dest_addr_length, ts);
    }